

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O0

void okim6295_alloc_rom(void *info,UINT32 memsize)

{
  void *pvVar1;
  okim6295_state *chip;
  UINT32 memsize_local;
  void *info_local;
  
  if (*(UINT32 *)((long)info + 0xfc) != memsize) {
    pvVar1 = realloc(*(void **)((long)info + 0x100),(ulong)memsize);
    *(void **)((long)info + 0x100) = pvVar1;
    *(UINT32 *)((long)info + 0xfc) = memsize;
    memset(*(void **)((long)info + 0x100),0xff,(ulong)*(uint *)((long)info + 0xfc));
  }
  return;
}

Assistant:

static void okim6295_alloc_rom(void* info, UINT32 memsize)
{
	okim6295_state *chip = (okim6295_state *)info;
	
	if (chip->ROMSize == memsize)
		return;
	
	chip->ROM = (UINT8*)realloc(chip->ROM, memsize);
	chip->ROMSize = memsize;
	memset(chip->ROM, 0xFF, chip->ROMSize);
	
	return;
}